

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  bool bVar1;
  uint uVar2;
  cmGlobalGenerator *pcVar3;
  char *pcVar4;
  string local_750;
  string local_730 [32];
  cmAlphaNum local_710;
  cmAlphaNum local_6e0;
  string local_6b0;
  undefined1 local_690 [8];
  ostringstream emsg_1;
  istream local_518 [8];
  ifstream ifs;
  undefined1 local_310 [8];
  string outputFileLocation;
  string local_2e8 [32];
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  string local_268;
  undefined1 local_248 [8];
  ostringstream emsg;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  undefined1 local_70 [8];
  string command;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string tmpOutputFile;
  string *targetName_local;
  cmCoreTryCompile *this_local;
  
  tmpOutputFile.field_2._8_8_ = targetName;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"/",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::operator+=((string *)local_38,(string *)tmpOutputFile.field_2._8_8_);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  uVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x26])();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)local_38,"_DEBUG");
  }
  std::__cxx11::string::operator+=((string *)local_38,"_loc");
  cmAlphaNum::cmAlphaNum(&local_a0,&this->BinaryDirectory);
  cmAlphaNum::cmAlphaNum(&local_d0,(string *)local_38);
  cmStrCat<>((string *)local_70,&local_a0,&local_d0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_70);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_310);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_518,pcVar4,_S_in);
    cmsys::SystemTools::GetLineFromStream
              (local_518,(string *)local_310,(bool *)0x0,0xffffffffffffffff);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_310);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath(&local_750,(string *)local_310);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_750);
      std::__cxx11::string::~string((string *)&local_750);
      outputFileLocation.field_2._12_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_690);
      std::operator<<((ostream *)local_690,"Recorded try_compile output location doesn\'t exist:\n")
      ;
      cmAlphaNum::cmAlphaNum(&local_6e0,"  ");
      cmAlphaNum::cmAlphaNum(&local_710,(string *)local_310);
      cmStrCat<char[2]>(&local_6b0,&local_6e0,&local_710,(char (*) [2])0xc47774);
      std::operator<<((ostream *)local_690,(string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,local_730);
      std::__cxx11::string::~string(local_730);
      outputFileLocation.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_690);
    }
    std::ifstream::~ifstream(local_518);
    std::__cxx11::string::~string((string *)local_310);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    std::operator<<((ostream *)local_248,
                    "Unable to find the recorded try_compile output location:\n");
    cmAlphaNum::cmAlphaNum(&local_298,"  ");
    cmAlphaNum::cmAlphaNum(&local_2c8,(string *)local_70);
    cmStrCat<char[2]>(&local_268,&local_298,&local_2c8,(char (*) [2])0xc47774);
    std::operator<<((ostream *)local_248,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->FindErrorMessage,local_2e8);
    std::__cxx11::string::~string(local_2e8);
    outputFileLocation.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;

  if (this->Makefile->GetGlobalGenerator()->IsMultiConfig()) {
    tmpOutputFile += "_DEBUG";
  }
  tmpOutputFile += "_loc";

  std::string command = cmStrCat(this->BinaryDirectory, tmpOutputFile);
  if (!cmSystemTools::FileExists(command)) {
    std::ostringstream emsg;
    emsg << "Unable to find the recorded try_compile output location:\n";
    emsg << cmStrCat("  ", command, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  std::string outputFileLocation;
  cmsys::ifstream ifs(command.c_str());
  cmSystemTools::GetLineFromStream(ifs, outputFileLocation);
  if (!cmSystemTools::FileExists(outputFileLocation)) {
    std::ostringstream emsg;
    emsg << "Recorded try_compile output location doesn't exist:\n";
    emsg << cmStrCat("  ", outputFileLocation, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  this->OutputFile = cmSystemTools::CollapseFullPath(outputFileLocation);
}